

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

_Bool IsRenderTextureValid(RenderTexture2D target)

{
  Texture2D texture;
  _Bool _Var1;
  int iVar2;
  undefined7 extraout_var;
  undefined1 auVar3 [16];
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  int in_stack_0000001c;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  
  if (in_stack_00000008 != 0) {
    texture._8_8_ = in_stack_00000028;
    texture._0_8_ = in_stack_00000020;
    texture.format = target.id;
    _Var1 = IsTextureValid(texture);
    if (_Var1) {
      auVar3._0_4_ = -(uint)(0 < in_stack_00000010);
      auVar3._4_4_ = -(uint)(0 < in_stack_00000014);
      auVar3._8_4_ = -(uint)(0 < in_stack_00000018);
      auVar3._12_4_ = -(uint)(0 < in_stack_0000001c);
      iVar2 = movmskps((int)CONCAT71(extraout_var,_Var1),auVar3);
      return iVar2 == 0xf && in_stack_0000000c != 0;
    }
  }
  return false;
}

Assistant:

bool IsRenderTextureValid(RenderTexture2D target)
{
    bool result = false;

    if ((target.id > 0) &&                  // Validate OpenGL id (loaded on GPU)
        IsTextureValid(target.depth) &&     // Validate FBO depth texture/renderbuffer attachment
        IsTextureValid(target.texture)) result = true; // Validate FBO texture attachment

    return result;
}